

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::__cxx11::string,char[12]>
          (String *__return_storage_ptr__,detail *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,char *op,
          char (*rhs) [12])

{
  size_t sVar1;
  char *__dest;
  ostream *stream;
  anon_union_24_2_13149d16_for_String_3 local_80;
  anon_union_24_2_13149d16_for_String_3 local_68;
  anon_union_24_2_13149d16_for_String_3 local_50;
  anon_union_24_2_13149d16_for_String_3 local_38;
  
  toStream<std::__cxx11::string>((String *)&local_50.data,this,lhs);
  sVar1 = strlen((char *)lhs);
  __dest = String::allocate((String *)&local_68.data,(size_type)sVar1);
  memcpy(__dest,lhs,sVar1 & 0xffffffff);
  operator+((String *)&local_38.data,(String *)&local_50.data,(String *)&local_68.data);
  stream = tlssPush();
  filldata<const_char[12]>::fill(stream,(char (*) [12])op);
  tlssPop();
  operator+(__return_storage_ptr__,(String *)&local_38.data,(String *)&local_80.data);
  if ((local_80.buf[0x17] < '\0') && (local_80.data.ptr != (char *)0x0)) {
    operator_delete__(local_80.data.ptr);
  }
  if ((local_38.buf[0x17] < '\0') && (local_38.data.ptr != (char *)0x0)) {
    operator_delete__(local_38.data.ptr);
  }
  if ((local_68.buf[0x17] < '\0') && (local_68.data.ptr != (char *)0x0)) {
    operator_delete__(local_68.data.ptr);
  }
  if ((local_50.buf[0x17] < '\0') && (local_50.data.ptr != (char *)0x0)) {
    operator_delete__(local_50.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }